

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  char cVar1;
  bool bVar2;
  ImGuiID id;
  ulong uVar3;
  char *pcVar4;
  ImGuiTableColumn *pIVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  bool hovered;
  bool held;
  ImRect hit_rect;
  bool local_5e;
  bool local_5d;
  float local_5c;
  ImRect local_58;
  undefined1 local_48 [16];
  ImGuiContext *local_38;
  
  local_38 = GImGui;
  if ((table->Flags & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x221f,"TableUpdateBorders","ImGui ASSERT FAILED: %s",
                "table->Flags & ImGuiTableFlags_Resizable");
  }
  if (table->IsUsingHeaders == false) {
    local_5c = (table->OuterRect).Min.y;
    fVar7 = (table->OuterRect).Max.y;
    fVar8 = table->LastOuterHeight;
  }
  else {
    local_5c = (table->OuterRect).Min.y;
    if ((table->Flags & 0x800) == 0) {
      fVar7 = table->LastFirstRowHeight + local_5c;
      goto LAB_001ee6c8;
    }
    fVar7 = (table->OuterRect).Max.y;
    fVar8 = table->LastOuterHeight;
  }
  uVar6 = -(uint)(fVar8 + local_5c <= fVar7);
  fVar7 = (float)(uVar6 & (uint)fVar7 | ~uVar6 & (uint)(fVar8 + local_5c));
LAB_001ee6c8:
  local_48 = ZEXT416((uint)fVar7);
  if (0 < table->ColumnsCount) {
    uVar3 = 0;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar3 & 0x3f) & 1) != 0) {
        pcVar4 = (table->DisplayOrderToIndex).Data + uVar3;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar4) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        cVar1 = *pcVar4;
        pIVar5 = (table->Columns).Data + cVar1;
        if ((table->Columns).DataEnd <= pIVar5) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        if ((pIVar5->Flags & 0x100020U) == 0) {
          id = TableGetColumnResizeID(table,(int)cVar1,(int)table->InstanceCurrent);
          local_58.Min.x = pIVar5->MaxX + -4.0;
          local_58.Max.x = pIVar5->MaxX + 4.0;
          local_58.Min.y = local_5c;
          local_58.Max.y = (float)local_48._0_4_;
          KeepAliveID(id);
          local_5e = false;
          local_5d = false;
          bVar2 = ButtonBehavior(&local_58,id,&local_5e,&local_5d,0x1a2);
          if (((bVar2) && (bVar2 = IsMouseDoubleClicked(0), bVar2)) && ((pIVar5->Flags & 8) == 0)) {
            TableSetColumnAutofit(table,(int)cVar1);
            ClearActiveID();
            local_5e = false;
            local_5d = false;
          }
          if (local_5d == true) {
            table->ResizedColumn = cVar1;
            table->InstanceInteracted = table->InstanceCurrent;
            if (local_5e != false) {
LAB_001ee839:
              if ((local_38->HoveredIdTimer <= 0.06 & (local_5d ^ 1U)) != 0) goto LAB_001ee86e;
            }
            table->HoveredColumnBorder = cVar1;
            SetMouseCursor(4);
          }
          else if (local_5e == true) goto LAB_001ee839;
        }
      }
LAB_001ee86e:
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)table->ColumnsCount);
  }
  return;
}

Assistant:

void    ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    const bool borders_full_height = (table->IsUsingHeaders == false) || (table->Flags & ImGuiTableFlags_BordersFullHeightV);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_full = ImMax(table->OuterRect.Max.y, hit_y1 + table->LastOuterHeight);
    const float hit_y2 = borders_full_height ? hit_y2_full : (hit_y1 + table->LastFirstRowHeight);

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, hit_y2);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick);
        if (pressed && IsMouseDoubleClicked(0) && !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
        {
            // FIXME-TABLE: Double-clicking on column edge could auto-fit Stretch column?
            TableSetColumnAutofit(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            table->ResizedColumn = (ImS8)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImS8)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}